

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall GraphPropagator::attachToAll(GraphPropagator *this)

{
  long lVar1;
  long lVar2;
  
  if (0 < (int)(this->vs).sz) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      BoolView::attach((BoolView *)
                       ((long)&(((this->vs).data)->super_Var).super_Branching._vptr_Branching +
                       lVar2),&this->super_Propagator,(int)lVar1,6);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < (int)(this->vs).sz);
  }
  if (0 < (int)(this->es).sz) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      BoolView::attach((BoolView *)
                       ((long)&(((this->es).data)->super_Var).super_Branching._vptr_Branching +
                       lVar2),&this->super_Propagator,(int)lVar1,6);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < (int)(this->es).sz);
  }
  return;
}

Assistant:

void GraphPropagator::attachToAll() {
	// Do not use in inheriting classes!!
	for (int j = 0; j < nbNodes(); j++) {
		getNodeVar(j).attach(this, j, EVENT_LU);
	}
	for (int j = 0; j < nbEdges(); j++) {
		getEdgeVar(j).attach(this, j, EVENT_LU);
	}
}